

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bool sb_reclaim_reusable_blocks(fdb_kvs_handle *handle)

{
  uint64_t uVar1;
  ulong uVar2;
  atomic<unsigned_char_*> *this;
  atomic<unsigned_long> *atomic_val;
  fdb_kvs_handle *in_RDI;
  stale_header_info sVar3;
  reusable_block_list rVar4;
  uint8_t *old_bmp;
  uint8_t *new_bmp;
  superblock *sb;
  reusable_block_list blist;
  stale_header_info sheader;
  uint64_t bmp_size_byte;
  uint64_t num_blocks;
  size_t i;
  fdb_kvs_handle *in_stack_00000270;
  stale_header_info in_stack_00000278;
  undefined4 in_stack_ffffffffffffff68;
  memory_order in_stack_ffffffffffffff6c;
  superblock *sb_00;
  err_log_callback *in_stack_ffffffffffffff78;
  uint64_t val;
  undefined8 in_stack_ffffffffffffff80;
  atomic<unsigned_char_*> *this_00;
  filemgr *in_stack_ffffffffffffff88;
  char *file;
  char *expression;
  reusable_block *local_68;
  atomic<unsigned_char_*> *local_60;
  char *local_58;
  superblock *count;
  char *bid;
  char *local_18;
  bool local_1;
  
  count = in_RDI->file->sb;
  filemgr_sync(in_stack_ffffffffffffff88,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0),
               in_stack_ffffffffffffff78);
  sVar3 = fdb_get_smallest_active_header(in_RDI);
  local_60 = (atomic<unsigned_char_*> *)sVar3.revnum;
  local_58 = (char *)sVar3.bid;
  if (local_58 == (char *)0xffffffffffffffff) {
    local_1 = false;
  }
  else {
    this_00 = local_60;
    file = local_58;
    rVar4 = fdb_get_reusable_block(in_stack_00000270,in_stack_00000278);
    expression = (char *)rVar4.n_blocks;
    local_68 = rVar4.blocks;
    if (expression == (char *)0x0) {
      local_1 = false;
    }
    else {
      val = 0;
      sb_00 = (superblock *)0x0;
      bid = expression;
      uVar1 = filemgr_get_pos((filemgr *)0x16d5da);
      uVar2 = uVar1 / in_RDI->file->blocksize;
      if (uVar2 < 4) {
        fdb_assert_die(expression,file,(int)((ulong)this_00 >> 0x20),val,(uint64_t)sb_00);
      }
      this = (atomic<unsigned_char_*> *)calloc(1,uVar2 + 7 >> 3);
      _free_bmp_idx((avl_tree *)sb_00);
      for (local_18 = (char *)0x0; local_18 < bid; local_18 = local_18 + 1) {
        sb_bmp_set((uint8_t *)sb_00,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   0x16d6ac);
        if ((local_18 == (char *)0x0) &&
           (uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)sb_00,in_stack_ffffffffffffff6c),
           uVar1 == 0xffffffffffffffff)) {
          atomic_store_uint64_t
                    ((atomic<unsigned_long> *)sb_00,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     memory_order_relaxed);
        }
        count->num_free_blocks = local_68[(long)local_18].count + count->num_free_blocks;
        _add_bmp_idx((avl_tree *)local_68,(bid_t)bid,(bid_t)count);
      }
      free(local_68);
      sb_bmp_change_begin(sb_00);
      atomic_val = (atomic<unsigned_long> *)
                   std::atomic<unsigned_char_*>::load(this,(memory_order)((ulong)sb_00 >> 0x20));
      std::atomic<unsigned_char_*>::store
                (this_00,(__pointer_type)this,(memory_order)((ulong)atomic_val >> 0x20));
      atomic_store_uint64_t
                (atomic_val,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 memory_order_relaxed);
      count->min_live_hdr_revnum = (uint64_t)local_60;
      count->min_live_hdr_bid = (bid_t)local_58;
      atomic_incr_uint64_t(atomic_val,in_stack_ffffffffffffff6c);
      count->num_init_free_blocks = count->num_free_blocks;
      sb_bmp_change_end((superblock *)0x16d82b);
      free(atomic_val);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool sb_reclaim_reusable_blocks(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_blocks, bmp_size_byte;
    stale_header_info sheader;
    reusable_block_list blist;
    struct superblock *sb = handle->file->sb;

    // should flush all dirty blocks in cache
    filemgr_sync(handle->file, false, &handle->log_callback);

    sheader = fdb_get_smallest_active_header(handle);
    if (sheader.bid == BLK_NOT_FOUND) {
        return false;
    }

    // get reusable block list
    blist = fdb_get_reusable_block(handle, sheader);
    if (blist.n_blocks == 0) {
        return false;
    }

    // update superblock's bitmap
    uint8_t *new_bmp = NULL, *old_bmp = NULL;
    num_blocks = filemgr_get_pos(handle->file) / handle->file->blocksize;
    // 8 bitmaps per byte
    bmp_size_byte = (num_blocks+7) / 8;
    fdb_assert(num_blocks >= SB_DEFAULT_NUM_SUPERBLOCKS,
               num_blocks, SB_DEFAULT_NUM_SUPERBLOCKS);
    new_bmp = (uint8_t*)calloc(1, bmp_size_byte);

    // free pre-existing bmp index
    _free_bmp_idx(&sb->bmp_idx);

    for (i=0; i<blist.n_blocks; ++i) {
        sb_bmp_set(new_bmp, blist.blocks[i].bid, blist.blocks[i].count);
        if (i==0 &&
            atomic_get_uint64_t(&sb->cur_alloc_bid) == BLK_NOT_FOUND) {
            atomic_store_uint64_t(&sb->cur_alloc_bid, blist.blocks[i].bid);
        }
        sb->num_free_blocks += blist.blocks[i].count;
        // add info for supplementary bmp index
        _add_bmp_idx(&sb->bmp_idx, blist.blocks[i].bid, blist.blocks[i].count);
    }
    free(blist.blocks);

    sb_bmp_change_begin(sb);
    old_bmp = sb->bmp.load(std::memory_order_relaxed);
    sb->bmp.store(new_bmp, std::memory_order_relaxed);
    atomic_store_uint64_t(&sb->bmp_size, num_blocks);
    sb->min_live_hdr_revnum = sheader.revnum;
    sb->min_live_hdr_bid = sheader.bid;
    atomic_incr_uint64_t(&sb->bmp_revnum);
    sb->num_init_free_blocks = sb->num_free_blocks;
    sb_bmp_change_end(sb);
    free(old_bmp);

    return true;
}